

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong extraout_RDX;
  long extraout_RDX_00;
  bool bVar8;
  Slice key;
  Status local_58;
  Slice local_50;
  Slice local_40;
  char *pcVar4;
  
  iVar3 = (*this->iter_->_vptr_Iterator[8])();
  pcVar4 = (char *)CONCAT44(extraout_var,iVar3);
  (*this->iter_->_vptr_Iterator[9])();
  while (uVar2 = this->bytes_until_read_sampling_, uVar2 < extraout_RDX_00 + extraout_RDX) {
    uVar6 = (ulong)(this->rnd_).seed_ * 0x41a7;
    uVar5 = (uint)uVar6 & 0x7fffffff;
    iVar3 = (int)(uVar6 >> 0x1f);
    uVar7 = iVar3 + uVar5;
    uVar5 = iVar3 + uVar5 + 0x80000001;
    if (-1 < (int)uVar7) {
      uVar5 = uVar7;
    }
    (this->rnd_).seed_ = uVar5;
    this->bytes_until_read_sampling_ = (uVar5 & 0x1fffff) + uVar2;
    key.size_ = extraout_RDX;
    key.data_ = pcVar4;
    DBImpl::RecordReadSample(this->db_,key);
  }
  this->bytes_until_read_sampling_ = uVar2 - (extraout_RDX_00 + extraout_RDX);
  if (extraout_RDX < 8) {
    bVar8 = false;
  }
  else {
    bVar1 = pcVar4[extraout_RDX - 8];
    bVar8 = bVar1 < 2;
    ikey->sequence =
         (ulong)CONCAT16(pcVar4[extraout_RDX - 1],
                         CONCAT15(pcVar4[extraout_RDX - 2],
                                  CONCAT14(pcVar4[extraout_RDX - 3],
                                           *(undefined4 *)(pcVar4 + (extraout_RDX - 7)))));
    ikey->type = (uint)bVar1;
    (ikey->user_key).data_ = pcVar4;
    (ikey->user_key).size_ = extraout_RDX - 8;
  }
  if (bVar8 == false) {
    local_40.data_ = "corrupted internal key in DBIter";
    local_40.size_ = 0x20;
    local_50.data_ = "";
    local_50.size_ = 0;
    Status::Status(&local_58,kCorruption,&local_40,&local_50);
    pcVar4 = (this->status_).state_;
    (this->status_).state_ = local_58.state_;
    if (pcVar4 != (char *)0x0) {
      local_58.state_ = pcVar4;
      operator_delete__(pcVar4);
    }
  }
  return bVar8;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}